

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamlogger.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ILogger *pIVar1;
  StreamLogger *this;
  
  pIVar1 = (ILogger *)operator_new(8);
  *(code **)pIVar1 = std::__cxx11::stringbuf::str;
  liblogger::LogManager::Add(pIVar1);
  this = (StreamLogger *)liblogger::GetStreamLogger();
  *(undefined4 *)(this + 0x188) = 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(this + 0x10),"Test StreamLogger",0x11);
  liblogger::StreamLogger::operator<<(this,std::endl<char,std::char_traits<char>>);
  liblogger::LogManager::RemoveAll();
  return 0;
}

Assistant:

int main(int argc, char ** argv)
{
	LogManager::Add(new LogStdout());

	LOGGER << LOGGER_INFO << "Test StreamLogger" << std::endl;

	LogManager::RemoveAll();
	return 0;
}